

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O3

void Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1maxiter_1set
               (JNIEnv *jenv,jclass jcls,jlong jarg1,jobject jarg1_,jlong jarg2)

{
  opt_s *arg1;
  
  if (jarg2 != 0) {
    if (jarg1 != 0) {
      *(undefined4 *)(jarg1 + 100) = *(undefined4 *)jarg2;
    }
    return;
  }
  SWIG_JavaThrowException(jenv,SWIG_JavaNullPointerException,"Attempt to dereference null uint32_t")
  ;
  return;
}

Assistant:

SWIGEXPORT void JNICALL Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1maxiter_1set(JNIEnv *jenv, jclass jcls, jlong jarg1, jobject jarg1_, jlong jarg2) {
  opt_s *arg1 = (opt_s *) 0 ;
  uint32_t arg2 ;
  uint32_t *argp2 ;
  
  (void)jenv;
  (void)jcls;
  (void)jarg1_;
  arg1 = *(opt_s **)&jarg1; 
  argp2 = *(uint32_t **)&jarg2; 
  if (!argp2) {
    SWIG_JavaThrowException(jenv, SWIG_JavaNullPointerException, "Attempt to dereference null uint32_t");
    return ;
  }
  arg2 = *argp2; 
  if (arg1) (arg1)->maxiter = arg2;
}